

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O2

void pltcalc::getdates<int>
               (int occ_date_id,int *occ_year,int *occ_month,int *occ_day,int *occ_hour,
               int *occ_minute)

{
  int iVar1;
  
  iVar1 = 1;
  if (granular_date_ != 0) {
    iVar1 = 0x5a0;
  }
  d((long)(occ_date_id / iVar1),occ_year,occ_month,occ_day);
  iVar1 = (occ_date_id % 0x5a0) * granular_date_;
  *occ_hour = iVar1 / 0x3c;
  *occ_minute = iVar1 % 0x3c;
  return;
}

Assistant:

inline void getdates(const occDateT occ_date_id, int &occ_year,
			     int &occ_month, int &occ_day, int &occ_hour,
			     int &occ_minute)
	{
		int days = occ_date_id / (1440 - 1439 * !granular_date_);
		d(days, occ_year, occ_month, occ_day);
		int minutes = (occ_date_id % 1440) * granular_date_;
		occ_hour = minutes / 60;
		occ_minute = minutes % 60;
	}